

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

int MatchFinder_Create(CMatchFinder *p,UInt32 historySize,UInt32 keepAddBufferBefore,
                      UInt32 matchMaxLen,UInt32 keepAddBufferAfter,ISzAllocPtr alloc)

{
  UInt32 UVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  CLzRef *pCVar6;
  uint local_7c;
  ulong uStack_68;
  UInt32 newCyclicBufferSize;
  size_t numSons;
  size_t newSize;
  UInt32 fixedHashSize;
  UInt32 hs2_1;
  UInt32 hs2;
  uint nbMax;
  uint numBits;
  UInt32 hsCur;
  UInt32 hs;
  size_t hashSizeSum;
  ISzAllocPtr alloc_local;
  UInt32 keepAddBufferAfter_local;
  UInt32 matchMaxLen_local;
  UInt32 keepAddBufferBefore_local;
  UInt32 historySize_local;
  CMatchFinder *p_local;
  
  p->keepSizeBefore = historySize + keepAddBufferBefore + 1;
  alloc_local._0_4_ = matchMaxLen + keepAddBufferAfter;
  if ((uint)alloc_local < p->numHashBytes) {
    alloc_local._0_4_ = p->numHashBytes;
  }
  p->keepSizeAfter = (uint)alloc_local;
  if (p->directInput != '\0') {
    p->blockSize = 0;
  }
  if (p->directInput == '\0') {
    UVar1 = GetBlockSize(p,historySize);
    iVar2 = LzInWindow_Create2(p,UVar1,alloc);
    if (iVar2 == 0) goto LAB_001c6678;
  }
  if (p->numHashOutBits == '\0') {
    numBits = MatchFinder_GetHashMask(p,historySize);
    nbMax = numBits;
    if ((p->expectedDataSize < (ulong)historySize) &&
       (nbMax = MatchFinder_GetHashMask(p,(UInt32)p->expectedDataSize), numBits < nbMax)) {
      nbMax = numBits;
    }
  }
  else {
    hs2 = (UInt32)p->numHashOutBits;
    if (p->numHashBytes == 2) {
      local_7c = 0x10;
    }
    else {
      local_7c = 0x20;
      if (p->numHashBytes == 3) {
        local_7c = 0x18;
      }
    }
    if (local_7c < hs2) {
      hs2 = local_7c;
    }
    if (hs2 < 0x20) {
      numBits = (1 << ((byte)hs2 & 0x1f)) - 1;
    }
    else {
      numBits = 0xffffffff;
    }
    uVar3 = numBits | 0xffff;
    if (4 < p->numHashBytes) {
      uVar3 = numBits | 0x3ffff;
    }
    numBits = uVar3;
    UVar1 = MatchFinder_GetHashMask2(p,historySize);
    if (UVar1 < numBits) {
      numBits = UVar1;
    }
    nbMax = numBits;
    if ((p->expectedDataSize < (ulong)historySize) &&
       (UVar1 = MatchFinder_GetHashMask2(p,(UInt32)p->expectedDataSize), UVar1 < numBits)) {
      nbMax = UVar1;
    }
  }
  p->hashMask = nbMax;
  if ((ulong)numBits + 1 < (ulong)numBits) {
    return 0;
  }
  newSize._4_4_ = 0;
  if ((2 < p->numHashBytes) && (p->numHashBytes_Min < 3)) {
    newSize._4_4_ = 0x400;
  }
  if ((3 < p->numHashBytes) && (p->numHashBytes_Min < 4)) {
    newSize._4_4_ = newSize._4_4_ + 0x10000;
  }
  lVar4 = (ulong)newSize._4_4_ + (ulong)numBits + 1;
  p->fixedHashSize = newSize._4_4_;
  p->matchMaxLen = matchMaxLen;
  uVar3 = historySize + 1;
  p->historySize = historySize;
  p->cyclicBufferSize = uVar3;
  uStack_68 = (ulong)uVar3;
  if (p->btMode != '\0') {
    uStack_68 = uStack_68 << 1;
  }
  uVar5 = lVar4 + uStack_68;
  if ((uStack_68 < uVar3) || (uVar5 < uStack_68)) {
    return 0;
  }
  uVar5 = uVar5 + 0xf & 0xfffffffffffffff0;
  if ((p->hash != (CLzRef *)0x0) && (uVar5 <= p->numRefs)) {
    return 1;
  }
  MatchFinder_FreeThisClassMemory(p,alloc);
  p->numRefs = uVar5;
  pCVar6 = AllocRefs(uVar5,alloc);
  p->hash = pCVar6;
  if (p->hash != (CLzRef *)0x0) {
    p->son = p->hash + lVar4;
    return 1;
  }
LAB_001c6678:
  MatchFinder_Free(p,alloc);
  return 0;
}

Assistant:

int MatchFinder_Create(CMatchFinder *p, UInt32 historySize,
    UInt32 keepAddBufferBefore, UInt32 matchMaxLen, UInt32 keepAddBufferAfter,
    ISzAllocPtr alloc)
{
  /* we need one additional byte in (p->keepSizeBefore),
     since we use MoveBlock() after (p->pos++) and before dictionary using */
  // keepAddBufferBefore = (UInt32)0xFFFFFFFF - (1 << 22); // for debug
  p->keepSizeBefore = historySize + keepAddBufferBefore + 1;

  keepAddBufferAfter += matchMaxLen;
  /* we need (p->keepSizeAfter >= p->numHashBytes) */
  if (keepAddBufferAfter < p->numHashBytes)
    keepAddBufferAfter = p->numHashBytes;
  // keepAddBufferAfter -= 2; // for debug
  p->keepSizeAfter = keepAddBufferAfter;

  if (p->directInput)
    p->blockSize = 0;
  if (p->directInput || LzInWindow_Create2(p, GetBlockSize(p, historySize), alloc))
  {
    size_t hashSizeSum;
    {
      UInt32 hs;
      UInt32 hsCur;
      
      if (p->numHashOutBits != 0)
      {
        unsigned numBits = p->numHashOutBits;
        const unsigned nbMax =
            (p->numHashBytes == 2 ? 16 :
            (p->numHashBytes == 3 ? 24 : 32));
        if (numBits > nbMax)
          numBits = nbMax;
        if (numBits >= 32)
          hs = (UInt32)0 - 1;
        else
          hs = ((UInt32)1 << numBits) - 1;
        // (hash_size >= (1 << 16)) : Required for (numHashBytes > 2)
        hs |= (1 << 16) - 1; /* don't change it! */
        if (p->numHashBytes >= 5)
          hs |= (256 << kLzHash_CrcShift_2) - 1;
        {
          const UInt32 hs2 = MatchFinder_GetHashMask2(p, historySize);
          if (hs > hs2)
            hs = hs2;
        }
        hsCur = hs;
        if (p->expectedDataSize < historySize)
        {
          const UInt32 hs2 = MatchFinder_GetHashMask2(p, (UInt32)p->expectedDataSize);
          if (hsCur > hs2)
            hsCur = hs2;
        }
      }
      else
      {
        hs = MatchFinder_GetHashMask(p, historySize);
        hsCur = hs;
        if (p->expectedDataSize < historySize)
        {
          hsCur = MatchFinder_GetHashMask(p, (UInt32)p->expectedDataSize);
          if (hsCur > hs) // is it possible?
            hsCur = hs;
        }
      }

      p->hashMask = hsCur;

      hashSizeSum = hs;
      hashSizeSum++;
      if (hashSizeSum < hs)
        return 0;
      {
        UInt32 fixedHashSize = 0;
        if (p->numHashBytes > 2 && p->numHashBytes_Min <= 2) fixedHashSize += kHash2Size;
        if (p->numHashBytes > 3 && p->numHashBytes_Min <= 3) fixedHashSize += kHash3Size;
        // if (p->numHashBytes > 4) p->fixedHashSize += hs4; // kHash4Size;
        hashSizeSum += fixedHashSize;
        p->fixedHashSize = fixedHashSize;
      }
    }

    p->matchMaxLen = matchMaxLen;

    {
      size_t newSize;
      size_t numSons;
      const UInt32 newCyclicBufferSize = historySize + 1; // do not change it
      p->historySize = historySize;
      p->cyclicBufferSize = newCyclicBufferSize; // it must be = (historySize + 1)
      
      numSons = newCyclicBufferSize;
      if (p->btMode)
        numSons <<= 1;
      newSize = hashSizeSum + numSons;

      if (numSons < newCyclicBufferSize || newSize < numSons)
        return 0;

      // aligned size is not required here, but it can be better for some loops
      #define NUM_REFS_ALIGN_MASK 0xF
      newSize = (newSize + NUM_REFS_ALIGN_MASK) & ~(size_t)NUM_REFS_ALIGN_MASK;

      // 22.02: we don't reallocate buffer, if old size is enough
      if (p->hash && p->numRefs >= newSize)
        return 1;
      
      MatchFinder_FreeThisClassMemory(p, alloc);
      p->numRefs = newSize;
      p->hash = AllocRefs(newSize, alloc);
      
      if (p->hash)
      {
        p->son = p->hash + hashSizeSum;
        return 1;
      }
    }
  }

  MatchFinder_Free(p, alloc);
  return 0;
}